

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O3

undefined1  [16] __thiscall
cfd::api::ElementsTransactionApi::EstimateFee
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *utxos,ConfidentialAssetId *fee_asset,Amount *txout_fee,Amount *utxo_fee,bool is_blind,
          uint64_t effective_fee_rate,int exponent,int minimum_bits,uint32_t *append_asset_count)

{
  pointer pEVar1;
  pointer pcVar2;
  Script SVar3;
  Script SVar4;
  Script SVar5;
  Script SVar6;
  long lVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  AddressType AVar10;
  char cVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  AddressType AVar15;
  uint uVar16;
  uint32_t uVar17;
  undefined8 uVar18;
  pointer pBVar19;
  CfdException *pCVar20;
  undefined1 extraout_DL;
  uint uVar21;
  Amount extraout_DL_00;
  Amount extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined8 extraout_RDX;
  uint uVar22;
  Script *pSVar23;
  size_t sVar24;
  pointer pEVar25;
  NetType type;
  uint32_t uVar26;
  _func_int **pp_Var27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined4 uStack_808;
  uint32_t txin_size;
  uint local_800;
  uint32_t wit_size;
  uint local_7f8;
  AddressType local_7f4;
  uint32_t local_7f0;
  FeeCalculator fee_calc;
  pointer local_7e8;
  pointer pSStack_7e0;
  undefined1 in_stack_fffffffffffff828;
  undefined7 uStack_7d7;
  Script *in_stack_fffffffffffff830;
  uint32_t in_stack_fffffffffffff838;
  undefined4 uStack_7c4;
  int in_stack_fffffffffffff840;
  undefined4 uStack_7bc;
  pointer in_stack_fffffffffffff848;
  uint in_stack_fffffffffffff850;
  uint32_t tx_size;
  pointer pBStack_7a0;
  pointer local_798;
  pointer local_788;
  Script *local_780;
  ulong local_778;
  ulong local_770;
  uint32_t rangeproof_size_cache;
  pointer local_760;
  _func_int **local_758;
  uint32_t tx_witness_size;
  char local_740 [16];
  undefined8 local_730;
  undefined1 local_728;
  Script claim_script;
  Script redeem_script;
  ElementsAddressFactory factory;
  ConfidentialTxInReference ref;
  Script local_500;
  DescriptorScriptData data;
  ConfidentialTransactionContext txc;
  Script local_d8;
  Script local_a0;
  Script local_68;
  
  ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,tx_hex);
  cVar11 = cfd::core::ConfidentialAssetId::IsEmpty();
  if (cVar11 != '\0') {
    data._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                 + 99;
    data.locking_script._vptr_Script._0_4_ = 0x228;
    data.locking_script.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "EstimateFee";
    core::logger::log<>((CfdSourceLocation *)&data,kCfdLogLevelWarning,
                        "Failed to EstimateFee. Empty fee asset.");
    pCVar20 = (CfdException *)__cxa_allocate_exception(0x30);
    data._0_8_ = &data.locking_script.script_data_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"Empty fee asset.","");
    core::CfdException::CfdException(pCVar20,kCfdIllegalArgumentError,(string *)&data);
    __cxa_throw(pCVar20,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList();
  if (redeem_script._vptr_Script !=
      (_func_int **)
      redeem_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pp_Var27 = redeem_script._vptr_Script;
    do {
      cfd::core::Script::Script((Script *)&data,(Script *)(pp_Var27 + 3));
      cVar11 = cfd::core::Script::IsEmpty();
      core::Script::~Script((Script *)&data);
      if (cVar11 != '\0') {
        cfd::core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)&data,(ConfidentialAssetId *)(pp_Var27 + 10));
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        sVar24 = CONCAT71(ref.super_AbstractTxInReference.txid_._vptr_Txid._1_7_,
                          ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_);
        if (sVar24 == CONCAT71(claim_script.script_data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               claim_script.script_data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_)) {
          if (sVar24 == 0) {
            bVar29 = false;
          }
          else {
            iVar14 = bcmp(ref.super_AbstractTxInReference._vptr_AbstractTxInReference,
                          claim_script._vptr_Script,sVar24);
            bVar29 = iVar14 != 0;
          }
        }
        else {
          bVar29 = true;
        }
        if (claim_script._vptr_Script !=
            (_func_int **)
            &claim_script.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(claim_script._vptr_Script);
        }
        if ((ByteData *)ref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
            &ref.super_AbstractTxInReference.txid_.data_) {
          operator_delete(ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
        }
        data._0_8_ = &PTR__ConfidentialAssetId_002b0ea0;
        if ((void *)CONCAT44(data.locking_script._vptr_Script._4_4_,
                             data.locking_script._vptr_Script._0_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(data.locking_script._vptr_Script._4_4_,
                                           data.locking_script._vptr_Script._0_4_));
        }
        if (bVar29) {
          data._0_8_ = (long)
                       "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                       + 99;
          data.locking_script._vptr_Script._0_4_ = 0x231;
          data.locking_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = "EstimateFee";
          core::logger::log<>((CfdSourceLocation *)&data,kCfdLogLevelWarning,
                              "Failed to EstimateFee. Unmatch fee asset.");
          pCVar20 = (CfdException *)__cxa_allocate_exception(0x30);
          data._0_8_ = &data.locking_script.script_data_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&data,"Unmatch fee asset.","");
          core::CfdException::CfdException(pCVar20,kCfdIllegalArgumentError,(string *)&data);
          __cxa_throw(pCVar20,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        std::
        vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
        ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   *)&redeem_script);
        goto LAB_00205268;
      }
      pp_Var27 = pp_Var27 + 0x1f;
    } while (pp_Var27 !=
             (_func_int **)
             redeem_script.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)&redeem_script);
  data._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(1);
  data.locking_script._vptr_Script._0_1_ = extraout_DL;
  cfd::core::ConfidentialTransaction::AddTxOutFee((Amount *)&txc,(ConfidentialAssetId *)&data);
LAB_00205268:
  wit_size = 0;
  txin_size = 0;
  rangeproof_size_cache = 0;
  pEVar25 = (utxos->
            super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (utxos->
           super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar26 = 0;
  uVar22 = 0;
  uVar16 = 0;
  if (pEVar25 != pEVar1) {
    local_760 = (pointer)&PTR__Txid_002b0f00;
    local_788 = (pointer)&PTR__ScriptWitness_002b0f60;
    local_758 = (_func_int **)&PTR__AddressFactory_002b1130;
    local_7f8 = 0;
    uVar22 = 0;
    uVar26 = 0;
    local_778 = 0;
    do {
      cfd::core::Address::GetAddress_abi_cxx11_();
      lVar7 = CONCAT44(data.locking_script._vptr_Script._4_4_,data.locking_script._vptr_Script._0_4_
                      );
      if ((ByteData *)data._0_8_ != &data.locking_script.script_data_) {
        operator_delete((void *)data._0_8_);
      }
      if (lVar7 == 0) {
        type = kLiquidV1;
      }
      else {
        type = *(NetType *)&(pEVar25->utxo).address;
      }
      ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)&factory.super_AddressFactory,type);
      txin_size = 0;
      wit_size = 0;
      cfd::core::Script::Script(&claim_script);
      local_7f0 = 0;
      local_770 = 0;
      if (pEVar25->is_pegin == true) {
        local_7f0 = pEVar25->pegin_btc_tx_size;
        local_770 = (ulong)pEVar25->pegin_txoutproof_size;
        cfd::core::Script::operator=(&claim_script,&pEVar25->claim_script);
      }
      _tx_witness_size = local_740;
      pcVar2 = (pEVar25->utxo).descriptor._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tx_witness_size,pcVar2,
                 pcVar2 + (pEVar25->utxo).descriptor._M_string_length);
      ref.super_AbstractTxInReference._vptr_AbstractTxInReference =
           (_func_int **)&ref.super_AbstractTxInReference.txid_.data_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ref,"");
      AddressFactory::ParseOutputDescriptor
                (&data,&factory.super_AddressFactory,(string *)&tx_witness_size,(string *)&ref,
                 (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                 0x0,(vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
                 (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
      if ((ByteData *)ref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
          &ref.super_AbstractTxInReference.txid_.data_) {
        operator_delete(ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
      }
      cfd::core::Address::GetAddress_abi_cxx11_();
      AVar10 = data.address_type;
      if (data.address_type == kP2shP2wpkhAddress ||
          CONCAT71(ref.super_AbstractTxInReference.txid_._vptr_Txid._1_7_,
                   ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_) == 0) {
        AVar15 = data.address_type;
        if ((ByteData *)ref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
            &ref.super_AbstractTxInReference.txid_.data_) {
          operator_delete(ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
          AVar15 = data.address_type;
        }
      }
      else {
        if ((ByteData *)ref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
            &ref.super_AbstractTxInReference.txid_.data_) {
          operator_delete(ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
        }
        AVar15 = data.address_type;
        if (AVar10 != kP2shP2wshAddress) {
          AVar15 = *(AddressType *)&(pEVar25->utxo).field_0xc4;
        }
      }
      local_7f4 = AVar15;
      cfd::core::Script::Script(&redeem_script);
      pSVar23 = &(pEVar25->utxo).redeem_script;
      cVar11 = cfd::core::Script::IsEmpty();
      if (cVar11 != '\0') {
        cVar11 = cfd::core::Script::IsEmpty();
        if (cVar11 == '\0') {
          pSVar23 = &data.redeem_script;
        }
      }
      cfd::core::Script::operator=(&redeem_script,pSVar23);
      uVar18 = cfd::core::Script::IsEmpty();
      if ((char)uVar18 == '\0') {
        uVar18 = cfd::core::Script::IsEmpty();
        local_780 = &(pEVar25->utxo).scriptsig_template;
        if ((char)uVar18 != '\0') {
          local_780 = (Script *)0x0;
        }
      }
      else {
        local_780 = (Script *)0x0;
      }
      uStack_808 = CONCAT13(pEVar25->is_issuance,(undefined3)uStack_808);
      local_800 = (uint)CONCAT71((int7)((ulong)uVar18 >> 8),pEVar25->is_blind_issuance);
      cfd::core::OutPoint::OutPoint
                ((OutPoint *)&local_7e8,&(pEVar25->utxo).txid,(pEVar25->utxo).vout);
      ConfidentialTransactionContext::GetTxIn(&ref,&txc,(OutPoint *)&local_7e8);
      local_7e8 = local_760;
      if (pSStack_7e0 != (pointer)0x0) {
        operator_delete(pSStack_7e0);
      }
      if (pEVar25->is_issuance == true) {
        local_7e8 = (pointer)0x0;
        pSStack_7e0 = (pointer)0x0;
        uVar28 = (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar28 == 0) {
          pBVar19 = (pointer)0x0;
          sVar24 = 0;
        }
        else {
          if ((long)uVar28 < 0) {
            std::__throw_bad_alloc();
          }
          pBVar19 = (pointer)operator_new(uVar28);
          sVar24 = (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        in_stack_fffffffffffff828 = (undefined1)(uVar28 + (long)pBVar19);
        uStack_7d7 = (undefined7)(uVar28 + (long)pBVar19 >> 8);
        local_7e8 = pBVar19;
        if (ref.asset_entropy_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            ref.asset_entropy_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pSStack_7e0 = (pointer)pBVar19;
          memmove(pBVar19,ref.asset_entropy_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar24);
        }
        pSStack_7e0 = (pointer)((long)&(pBVar19->data_).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + sVar24);
        cVar11 = cfd::core::ByteData256::IsEmpty();
        if (cVar11 == '\0') {
          _tx_size = (pointer)0x0;
          pBStack_7a0 = (pointer)0x0;
          local_798 = (pointer)0x0;
          uVar28 = (long)ref.blinding_nonce_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ref.blinding_nonce_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar28 == 0) {
            pBVar19 = (pointer)0x0;
            sVar24 = 0;
          }
          else {
            if ((long)uVar28 < 0) {
              std::__throw_bad_alloc();
            }
            pBVar19 = (pointer)operator_new(uVar28);
            sVar24 = (long)ref.blinding_nonce_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)ref.blinding_nonce_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
          }
          local_798 = (pointer)(uVar28 + (long)pBVar19);
          _tx_size = pBVar19;
          if (ref.blinding_nonce_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              ref.blinding_nonce_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pBStack_7a0 = pBVar19;
            memmove(pBVar19,ref.blinding_nonce_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,sVar24);
          }
          pBStack_7a0 = (pointer)((long)&(pBVar19->data_).
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + sVar24);
          bVar12 = cfd::core::ByteData256::IsEmpty();
          if (_tx_size != (pointer)0x0) {
            operator_delete(_tx_size);
          }
          bVar12 = bVar12 ^ 1;
        }
        else {
          bVar12 = 0;
        }
        if (local_7e8 != (pointer)0x0) {
          operator_delete(local_7e8);
        }
      }
      else {
        if (pEVar25->is_blind_issuance == false) {
          local_7e8 = (pointer)0x0;
          pSStack_7e0 = (pointer)0x0;
          uVar28 = (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar28 == 0) {
            pBVar19 = (pointer)0x0;
            sVar24 = 0;
          }
          else {
            if ((long)uVar28 < 0) {
              std::__throw_bad_alloc();
            }
            pBVar19 = (pointer)operator_new(uVar28);
            sVar24 = (long)ref.asset_entropy_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)ref.asset_entropy_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
          }
          in_stack_fffffffffffff828 = (undefined1)(uVar28 + (long)pBVar19);
          uStack_7d7 = (undefined7)(uVar28 + (long)pBVar19 >> 8);
          local_7e8 = pBVar19;
          if (ref.asset_entropy_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              ref.asset_entropy_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pSStack_7e0 = (pointer)pBVar19;
            memmove(pBVar19,ref.asset_entropy_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,sVar24);
          }
          pSStack_7e0 = (pointer)((long)&(pBVar19->data_).
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + sVar24);
          cVar11 = cfd::core::ByteData256::IsEmpty();
          if (local_7e8 != (pointer)0x0) {
            operator_delete(local_7e8);
          }
          if (cVar11 == '\0') {
            local_7e8 = (pointer)0x0;
            pSStack_7e0 = (pointer)0x0;
            uVar28 = (long)ref.blinding_nonce_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)ref.blinding_nonce_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            if (uVar28 == 0) {
              pBVar19 = (pointer)0x0;
              sVar24 = 0;
            }
            else {
              if ((long)uVar28 < 0) {
                std::__throw_bad_alloc();
              }
              pBVar19 = (pointer)operator_new(uVar28);
              sVar24 = (long)ref.blinding_nonce_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)ref.blinding_nonce_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
            }
            in_stack_fffffffffffff828 = (undefined1)(uVar28 + (long)pBVar19);
            uStack_7d7 = (undefined7)(uVar28 + (long)pBVar19 >> 8);
            local_7e8 = pBVar19;
            if (ref.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                ref.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              pSStack_7e0 = (pointer)pBVar19;
              memmove(pBVar19,ref.blinding_nonce_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,sVar24);
            }
            pSStack_7e0 = (pointer)((long)&(pBVar19->data_).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + sVar24);
            bVar13 = cfd::core::ByteData256::IsEmpty();
            if (local_7e8 != (pointer)0x0) {
              operator_delete(local_7e8);
            }
            bVar12 = bVar13 ^ 1;
            local_800 = (uint)is_blind;
            if (bVar13 == 0) {
              local_800 = 1;
            }
            uStack_808 = CONCAT13(1,(undefined3)uStack_808);
            goto LAB_002058a4;
          }
        }
        bVar12 = 0;
      }
LAB_002058a4:
      uVar16 = cfd::core::ScriptWitness::GetWitnessNum();
      if (5 < uVar16) {
        local_7e8 = local_788;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&pSStack_7e0
                   ,&ref.pegin_witness_.witness_stack_);
        cfd::core::ScriptWitness::GetWitness();
        local_7e8 = local_788;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&pSStack_7e0
                  );
        local_7f0 = cfd::core::ByteData::GetDataSize();
        local_770 = cfd::core::ByteData::GetDataSize();
        cfd::core::Script::Script((Script *)&local_7e8,_tx_size + 3);
        cfd::core::Script::operator=(&claim_script,(Script *)&local_7e8);
        core::Script::~Script((Script *)&local_7e8);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&tx_size);
      }
      if (pEVar25->is_issuance == true) {
        local_7e8 = (pointer)0x0;
        pSStack_7e0 = (pointer)0x0;
        uVar28 = (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ref.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar28 == 0) {
          pBVar19 = (pointer)0x0;
          sVar24 = 0;
        }
        else {
          if ((long)uVar28 < 0) {
            std::__throw_bad_alloc();
          }
          pBVar19 = (pointer)operator_new(uVar28);
          sVar24 = (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ref.asset_entropy_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        in_stack_fffffffffffff828 = (undefined1)(uVar28 + (long)pBVar19);
        uStack_7d7 = (undefined7)(uVar28 + (long)pBVar19 >> 8);
        local_7e8 = pBVar19;
        if (ref.asset_entropy_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            ref.asset_entropy_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pSStack_7e0 = (pointer)pBVar19;
          memmove(pBVar19,ref.asset_entropy_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,sVar24);
        }
        pSStack_7e0 = (pointer)((long)&(pBVar19->data_).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + sVar24);
        cVar11 = cfd::core::ByteData256::IsEmpty();
        if (local_7e8 != (pointer)0x0) {
          operator_delete(local_7e8);
        }
        if (cVar11 == '\0') goto LAB_00205a10;
      }
      else {
LAB_00205a10:
        if ((pEVar25->is_pegin != true) ||
           (uVar16 = cfd::core::ScriptWitness::GetWitnessNum(), 5 < uVar16)) {
          cfd::core::Script::Script(&local_500,&redeem_script);
          cfd::core::Script::Script(&local_68,&claim_script);
          SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_780;
          SVar4._vptr_Script = (_func_int **)&local_68;
          SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (int)&wit_size;
          SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)&wit_size >> 0x20);
          SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&txin_size;
          SVar4.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = uStack_808;
          SVar4.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_start._4_4_ = txin_size;
          SVar4.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_800;
          SVar4.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ = wit_size;
          SVar4.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_7f8;
          SVar4.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_7f4;
          SVar6._vptr_Script._4_4_ = fee_calc.baserate_;
          SVar6._vptr_Script._0_4_ = local_7f0;
          SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_7e8;
          SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pSStack_7e0;
          SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_fffffffffffff828;
          SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uStack_7d7;
          SVar6.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff830;
          SVar6.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff838;
          SVar6.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_7c4;
          SVar6.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff840;
          SVar6.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uStack_7bc;
          cfd::core::ConfidentialTxInReference::EstimateTxInSize
                    ((AddressType)&ref,SVar4,SUB41(local_7f4,0),(int)&local_500,local_800 & 0xff,
                     SVar6,(Script *)(ulong)(uint)exponent,(uint *)(ulong)(uint)minimum_bits,
                     (uint *)in_stack_fffffffffffff848);
          core::Script::~Script(&local_68);
          core::Script::~Script(&local_500);
        }
      }
      core::ConfidentialTxInReference::~ConfidentialTxInReference(&ref);
      uVar17 = uVar26 + 2;
      if (uStack_808._3_1_ == 0) {
        uVar17 = uVar26;
      }
      if (bVar12 != 0) {
        uVar17 = uVar26 + 1;
      }
      if (txin_size == 0) {
        cfd::core::Script::Script(&local_a0,&redeem_script);
        cfd::core::Script::Script(&local_d8,&claim_script);
        SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)&txin_size;
        SVar3._vptr_Script = (_func_int **)&wit_size;
        SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_1_ = bVar12;
        SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_780;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = exponent;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = minimum_bits;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)&rangeproof_size_cache;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (int)((ulong)&rangeproof_size_cache >> 0x20);
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = uStack_808;
        SVar5._vptr_Script = (_func_int **)local_770;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = txin_size;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_800;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = wit_size;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_7f8;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_7f4;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = local_7f0;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = fee_calc.baserate_;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_7e8;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = pSStack_7e0;
        cfd::core::ConfidentialTxIn::EstimateTxInSize
                  (local_7f4,SVar3,(uint)&local_a0,SVar5,SUB41(local_7f0,0),SUB81(&local_d8,0),
                   (uint *)(ulong)uStack_808._3_1_,(uint *)(ulong)(byte)local_800,
                   (bool)in_stack_fffffffffffff828,in_stack_fffffffffffff830,
                   in_stack_fffffffffffff838,in_stack_fffffffffffff840,
                   (uint *)in_stack_fffffffffffff848,in_stack_fffffffffffff850);
        core::Script::~Script(&local_d8);
        core::Script::~Script(&local_a0);
      }
      uVar9 = wit_size;
      uVar8 = txin_size;
      local_778 = (ulong)((int)local_778 + (uint)(wit_size == 0));
      core::Script::~Script(&redeem_script);
      DescriptorScriptData::~DescriptorScriptData(&data);
      if (_tx_witness_size != local_740) {
        operator_delete(_tx_witness_size);
      }
      uVar26 = uVar17 + 1;
      local_7f8 = local_7f8 + uVar8;
      uVar22 = uVar22 + uVar9;
      core::Script::~Script(&claim_script);
      factory.super_AddressFactory._vptr_AddressFactory = local_758;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&factory.super_AddressFactory.prefix_list_);
      pEVar25 = pEVar25 + 1;
    } while (pEVar25 != pEVar1);
    uVar21 = (uint)local_778;
    uVar16 = local_7f8;
    if ((uVar22 != 0 && uVar21 != 0) &&
       (uVar21 < (uint)((int)((ulong)((long)(utxos->
                                            super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(utxos->
                                           super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x24ca58e9))) {
      uVar22 = uVar22 + uVar21 * 4;
    }
  }
  uVar17 = cfd::core::AbstractTransaction::GetVsizeFromSize(uVar16,uVar22);
  _tx_witness_size = _tx_witness_size & 0xffffffff00000000;
  _tx_size = (pointer)((ulong)_tx_size & 0xffffffff00000000);
  if ((append_asset_count != (uint32_t *)0x0) &&
     (uVar26 = uVar26 + *append_asset_count, 0xfe < uVar26)) {
    uVar26 = 0xff;
  }
  ConfidentialTransactionContext::GetSizeIgnoreTxIn
            (&txc,is_blind,&tx_witness_size,&tx_size,exponent,minimum_bits,uVar26);
  uVar26 = cfd::core::AbstractTransaction::GetVsizeFromSize(tx_size,tx_witness_size);
  FeeCalculator::FeeCalculator(&fee_calc,effective_fee_rate);
  ref.super_AbstractTxInReference._vptr_AbstractTxInReference =
       (_func_int **)FeeCalculator::GetFee(&fee_calc,uVar26);
  ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_ = extraout_DL_00;
  claim_script._vptr_Script = (_func_int **)FeeCalculator::GetFee(&fee_calc,uVar17);
  claim_script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL_01;
  uVar26 = cfd::core::AbstractTransaction::GetVsizeFromSize
                     (uVar16 + tx_size,uVar22 + tx_witness_size);
  local_730 = FeeCalculator::GetFee(&fee_calc,uVar26);
  if (txout_fee != (Amount *)0x0) {
    txout_fee[8] = ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_;
    *(_func_int ***)txout_fee = ref.super_AbstractTxInReference._vptr_AbstractTxInReference;
  }
  if (utxo_fee != (Amount *)0x0) {
    utxo_fee[8] = claim_script.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_;
    *(_func_int ***)utxo_fee = claim_script._vptr_Script;
  }
  data._0_8_ = (long)
               "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
               + 99;
  data.locking_script._vptr_Script._0_4_ = 0x2cd;
  data.locking_script.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "EstimateFee";
  local_728 = extraout_DL_02;
  redeem_script._vptr_Script = (_func_int **)cfd::core::Amount::GetSatoshiValue();
  local_7e8 = (pointer)cfd::core::Amount::GetSatoshiValue();
  factory.super_AddressFactory._vptr_AddressFactory =
       (_func_int **)cfd::core::Amount::GetSatoshiValue();
  core::logger::log<unsigned_long&,long&,long&,long&>
            ((CfdSourceLocation *)&data,kCfdLogLevelInfo,"EstimateFee rate={} fee={} tx={} utxo={}",
             &effective_fee_rate,(long *)&redeem_script,(long *)&local_7e8,(long *)&factory);
  ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  auVar30._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  auVar30[8] = local_728;
  auVar30._0_8_ = local_730;
  return auVar30;
}

Assistant:

Amount ElementsTransactionApi::EstimateFee(
    const std::string& tx_hex, const std::vector<ElementsUtxoAndOption>& utxos,
    const ConfidentialAssetId& fee_asset, Amount* txout_fee, Amount* utxo_fee,
    bool is_blind, uint64_t effective_fee_rate, int exponent, int minimum_bits,
    uint32_t* append_asset_count) const {
  ConfidentialTransactionContext txc(tx_hex);

  if (fee_asset.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to EstimateFee. Empty fee asset.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty fee asset.");
  }

  // check fee in txout
  bool exist_fee = false;
  for (const auto& txout : txc.GetTxOutList()) {
    if (txout.GetLockingScript().IsEmpty()) {
      if (txout.GetAsset().GetHex() != fee_asset.GetHex()) {
        warn(CFD_LOG_SOURCE, "Failed to EstimateFee. Unmatch fee asset.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Unmatch fee asset.");
      }
      exist_fee = true;
      break;
    }
  }
  if (!exist_fee) {
    txc.AddTxOutFee(Amount::CreateBySatoshiAmount(1), fee_asset);  // dummy fee
  }

  uint32_t size = 0;
  uint32_t witness_size = 0;
  uint32_t wit_size = 0;
  uint32_t txin_size = 0;
  uint32_t rangeproof_size_cache = 0;
  uint32_t asset_count = 0;
  uint32_t not_witness_count = 0;
  for (const auto& utxo : utxos) {
    NetType net_type = NetType::kLiquidV1;
    if (!utxo.utxo.address.GetAddress().empty()) {
      net_type = utxo.utxo.address.GetNetType();
    }
    ElementsAddressFactory factory(net_type);

    uint32_t pegin_btc_tx_size = 0;
    uint32_t pegin_txoutproof_size = 0;
    txin_size = 0;
    wit_size = 0;
    Script claim_script;
    if (utxo.is_pegin) {
      pegin_btc_tx_size = utxo.pegin_btc_tx_size;
      pegin_txoutproof_size = utxo.pegin_txoutproof_size;
      claim_script = utxo.claim_script;
    }
    // check descriptor
    std::string descriptor = utxo.utxo.descriptor;
    // set dummy NetType for getting AddressType.
    auto data = factory.ParseOutputDescriptor(descriptor, "");

    AddressType addr_type;
    if (utxo.utxo.address.GetAddress().empty() ||
        data.address_type == AddressType::kP2shP2wpkhAddress ||
        data.address_type == AddressType::kP2shP2wshAddress) {
      addr_type = data.address_type;
    } else {
      addr_type = utxo.utxo.address.GetAddressType();
    }

    Script redeem_script;
    if (utxo.utxo.redeem_script.IsEmpty() && !data.redeem_script.IsEmpty()) {
      redeem_script = data.redeem_script;
    } else {
      redeem_script = utxo.utxo.redeem_script;
    }
    const Script* scriptsig_template = nullptr;
    if ((!redeem_script.IsEmpty()) &&
        (!utxo.utxo.scriptsig_template.IsEmpty())) {
      scriptsig_template = &utxo.utxo.scriptsig_template;
    }
    bool is_issuance = utxo.is_issuance;
    bool is_reissuance = false;
    bool is_blind_issuance = utxo.is_blind_issuance;
    try {
      auto ref = txc.GetTxIn(OutPoint(utxo.utxo.txid, utxo.utxo.vout));
      if (utxo.is_issuance) {
        if ((!ref.GetAssetEntropy().IsEmpty()) &&
            (!ref.GetBlindingNonce().IsEmpty())) {
          is_reissuance = true;
        }
      } else if ((!utxo.is_issuance) && (!utxo.is_blind_issuance)) {  // init
        if (!ref.GetAssetEntropy().IsEmpty()) {
          is_issuance = true;
          is_blind_issuance = is_blind;
          if (!ref.GetBlindingNonce().IsEmpty()) {
            is_reissuance = true;
            is_blind_issuance = true;
          }
        }
      }
      if (ref.GetPeginWitnessStackNum() >= 6) {
        std::vector<ByteData> pegin_stack = ref.GetPeginWitness().GetWitness();
        pegin_btc_tx_size =
            static_cast<uint32_t>(pegin_stack[4].GetDataSize());
        pegin_txoutproof_size =
            static_cast<uint32_t>(pegin_stack[5].GetDataSize());
        claim_script = Script(pegin_stack[3]);
      }

      if (utxo.is_issuance && ref.GetAssetEntropy().IsEmpty()) {
        // unmatch pattern. (using input utxo data)
      } else if (utxo.is_pegin && (ref.GetPeginWitnessStackNum() < 6)) {
        // unmatch pattern. (using input utxo data)
      } else {
        ref.EstimateTxInSize(
            addr_type, redeem_script, is_blind_issuance, exponent,
            minimum_bits, claim_script, scriptsig_template, &wit_size,
            &txin_size);
      }
    } catch (const CfdException& except) {
      info(CFD_LOG_SOURCE, "Error:{}", std::string(except.what()));
    }

    if (is_reissuance)
      ++asset_count;
    else if (is_issuance)
      asset_count += 2;

    ++asset_count;
    if (txin_size == 0) {
      ConfidentialTxIn::EstimateTxInSize(
          addr_type, redeem_script, pegin_btc_tx_size, claim_script,
          is_issuance, is_blind_issuance, &wit_size, &txin_size, is_reissuance,
          scriptsig_template, exponent, minimum_bits, &rangeproof_size_cache,
          pegin_txoutproof_size);
    }
    size += txin_size;
    witness_size += wit_size;
    if (wit_size == 0) ++not_witness_count;
  }
  if ((witness_size != 0) && (not_witness_count != 0) &&
      (not_witness_count < static_cast<uint32_t>(utxos.size()))) {
    // append witness size for p2pkh or p2sh
    witness_size += not_witness_count * 4;
  }

  uint32_t utxo_vsize =
      AbstractTransaction::GetVsizeFromSize(size, witness_size);

  uint32_t tx_witness_size = 0;
  uint32_t tx_size = 0;
  if (append_asset_count != nullptr) {
    if ((asset_count + *append_asset_count) < 255) {
      asset_count += *append_asset_count;
    } else {
      asset_count = 255;
    }
  }
  txc.GetSizeIgnoreTxIn(
      is_blind, &tx_witness_size, &tx_size, exponent, minimum_bits,
      asset_count);
  uint32_t tx_vsize =
      AbstractTransaction::GetVsizeFromSize(tx_size, tx_witness_size);

  FeeCalculator fee_calc(effective_fee_rate);
  Amount tx_fee_amount = fee_calc.GetFee(tx_vsize);
  Amount utxo_fee_amount = fee_calc.GetFee(utxo_vsize);
  uint32_t total_vsize = AbstractTransaction::GetVsizeFromSize(
      tx_size + size, tx_witness_size + witness_size);
  Amount fee = fee_calc.GetFee(total_vsize);

  if (txout_fee) *txout_fee = tx_fee_amount;
  if (utxo_fee) *utxo_fee = utxo_fee_amount;

  info(
      CFD_LOG_SOURCE, "EstimateFee rate={} fee={} tx={} utxo={}",
      effective_fee_rate, fee.GetSatoshiValue(),
      tx_fee_amount.GetSatoshiValue(), utxo_fee_amount.GetSatoshiValue());
  return fee;
}